

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O3

bool WTF::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  ulong uVar6;
  Elf64_Word EVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word EVar10;
  ulong uVar11;
  size_t count;
  Elf64_Word *pEVar12;
  int iVar13;
  int iVar14;
  undefined6 in_register_00000032;
  ulong uVar15;
  Elf64_Shdr buf [16];
  undefined1 auStack_438 [4];
  Elf64_Word local_434 [257];
  
  iVar13 = 0;
  iVar14 = (int)CONCAT62(in_register_00000032,sh_num);
  if (iVar14 != 0) {
    do {
      count = (long)(iVar14 - iVar13) << 6;
      if (0x3ff < count) {
        count = 0x400;
      }
      uVar11 = ReadFromOffset(fd,auStack_438,count,(long)iVar13 * 0x40 + sh_offset);
      if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
        abort();
      }
      pEVar12 = local_434;
      uVar15 = uVar11 >> 6;
      uVar6 = uVar11;
      while (uVar6 != 0) {
        if (*pEVar12 == type) {
          EVar9 = pEVar12[-1];
          EVar10 = pEVar12[0];
          EVar1 = *(Elf64_Xword *)(pEVar12 + 1);
          EVar2 = *(Elf64_Addr *)(pEVar12 + 3);
          EVar3 = *(Elf64_Off *)(pEVar12 + 5);
          EVar4 = *(Elf64_Xword *)(pEVar12 + 7);
          EVar7 = pEVar12[9];
          EVar8 = pEVar12[10];
          EVar5 = *(Elf64_Xword *)(pEVar12 + 0xd);
          out->sh_addralign = *(Elf64_Xword *)(pEVar12 + 0xb);
          out->sh_entsize = EVar5;
          out->sh_size = EVar4;
          out->sh_link = EVar7;
          out->sh_info = EVar8;
          out->sh_addr = EVar2;
          out->sh_offset = EVar3;
          out->sh_name = EVar9;
          out->sh_type = EVar10;
          out->sh_flags = EVar1;
          iVar13 = 1;
          goto LAB_00106c5a;
        }
        pEVar12 = pEVar12 + 0x10;
        uVar15 = uVar15 - 1;
        uVar6 = uVar15;
      }
      iVar13 = iVar13 + (int)(uVar11 >> 6);
    } while (iVar13 < iVar14);
    iVar13 = 0;
  }
LAB_00106c5a:
  return SUB41(iVar13,0);
}

Assistant:

static bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}